

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

DOHcode rdata(uchar *doh,size_t dohlen,unsigned_short rdlength,unsigned_short type,int index,
             dohentry *d)

{
  anon_union_16_2_f9ece763_for_ip *paVar1;
  byte bVar2;
  undefined8 uVar3;
  CURLcode CVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  undefined6 in_register_0000000a;
  dynbuf *s;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  uVar8 = (ulong)(uint)index;
  iVar7 = (int)CONCAT62(in_register_0000000a,type);
  if (iVar7 == 0x1c) {
    if (rdlength != 0x10) {
      return DOH_DNS_RDATA_LEN;
    }
    iVar7 = d->numaddr;
    lVar5 = (long)iVar7;
    if (0x17 < lVar5) {
      return DOH_OK;
    }
    d->addr[lVar5].type = 0x1c;
    uVar3 = *(undefined8 *)(doh + index + 8);
    paVar1 = &d->addr[lVar5].ip;
    *(undefined8 *)paVar1 = *(undefined8 *)(doh + index);
    *(undefined8 *)((long)paVar1 + 8) = uVar3;
  }
  else {
    if (iVar7 == 5) {
      iVar7 = d->numcname;
      if ((long)iVar7 == 4) {
        return DOH_OK;
      }
      d->numcname = iVar7 + 1;
      s = d->cname + iVar7;
      iVar7 = -0x7f;
      do {
        if (dohlen <= uVar8) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        bVar2 = doh[uVar8];
        uVar10 = (uint)bVar2;
        if ((bVar2 & 0xc0) == 0) {
          if (uVar10 == 0) {
            return DOH_OK;
          }
          sVar6 = Curl_dyn_len(s);
          if ((sVar6 != 0) && (CVar4 = Curl_dyn_addn(s,".",1), CVar4 != CURLE_OK)) {
            return DOH_OUT_OF_MEM;
          }
          uVar9 = (int)uVar8 + 1;
          uVar8 = (ulong)(uVar9 + uVar10);
          if (dohlen < uVar8) {
            return DOH_DNS_BAD_LABEL;
          }
          CVar4 = Curl_dyn_addn(s,doh + uVar9,(ulong)uVar10);
          if (CVar4 != CURLE_OK) {
            return DOH_OUT_OF_MEM;
          }
        }
        else {
          if ((bVar2 & 0xc0) != 0xc0) {
            return DOH_DNS_BAD_LABEL;
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          if (dohlen <= uVar8) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          uVar8 = (ulong)((uint)doh[uVar8] | (uVar10 & 0x3f) << 8);
        }
        if ((uVar10 == 0) || (bVar11 = iVar7 == 0, iVar7 = iVar7 + 1, bVar11)) {
          return (uint)(bVar2 != 0) * 3;
        }
      } while( true );
    }
    if (iVar7 != 1) {
      return DOH_OK;
    }
    if (rdlength != 4) {
      return DOH_DNS_RDATA_LEN;
    }
    iVar7 = d->numaddr;
    lVar5 = (long)iVar7;
    if (0x17 < lVar5) {
      return DOH_OK;
    }
    d->addr[lVar5].type = 1;
    *(undefined4 *)&d->addr[lVar5].ip = *(undefined4 *)(doh + index);
  }
  d->numaddr = iVar7 + 1;
  return DOH_OK;
}

Assistant:

static DOHcode rdata(const unsigned char *doh,
                     size_t dohlen,
                     unsigned short rdlength,
                     unsigned short type,
                     int index,
                     struct dohentry *d)
{
  /* RDATA
     - A (TYPE 1):  4 bytes
     - AAAA (TYPE 28): 16 bytes
     - NS (TYPE 2): N bytes */
  DOHcode rc;

  switch(type) {
  case DNS_TYPE_A:
    if(rdlength != 4)
      return DOH_DNS_RDATA_LEN;
    rc = store_a(doh, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_AAAA:
    if(rdlength != 16)
      return DOH_DNS_RDATA_LEN;
    rc = store_aaaa(doh, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_CNAME:
    rc = store_cname(doh, dohlen, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_DNAME:
    /* explicit for clarity; just skip; rely on synthesized CNAME  */
    break;
  default:
    /* unsupported type, just skip it */
    break;
  }
  return DOH_OK;
}